

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.h
# Opt level: O2

void tcmalloc::SymbolizerAPI::With
               (FunctionRef<void_(const_tcmalloc::SymbolizerAPI_&)> body,
               FunctionRef<void_(const_tcmalloc::SymbolizeOutcome_&)> callback)

{
  undefined1 local_40 [8];
  FunctionRef<void_(const_tcmalloc::SymbolizeOutcome_&)> callback_local;
  
  callback_local.fn = (_func_void_SymbolizeOutcome_ptr_void_ptr *)callback.data;
  local_40 = (undefined1  [8])callback.fn;
  SymbolizerAPI((SymbolizerAPI *)&callback_local.data,
                (FunctionRef<void_(const_tcmalloc::SymbolizeOutcome_&)> *)local_40);
  (*body.fn)((SymbolizerAPI *)&callback_local.data,body.data);
  ~SymbolizerAPI((SymbolizerAPI *)&callback_local.data);
  return;
}

Assistant:

static void With(FunctionRef<void(const SymbolizerAPI& api)> body,
                   FunctionRef<void(const SymbolizeOutcome&)> callback) {
    body(SymbolizerAPI{&callback});
  }